

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan_string(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong pos;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18.data_ = (this->m_in).data_;
  local_18.size_ = (this->m_in).size_;
  uVar4 = this->m_pos;
  pos = this->m_tok_start;
  if (uVar4 < local_18.size_) {
    uVar2 = uVar4;
    bVar3 = false;
    do {
      uVar4 = uVar2 + 1;
      this->m_pos = uVar4;
      cVar1 = local_18.data_[uVar2];
      if (!(bool)(bVar3 | cVar1 == '\\')) {
        if (local_18.size_ <= pos) {
          __assert_fail("pos < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/inja.hpp"
                        ,0x340,
                        "const_reference nonstd::sv_lite::basic_string_view<char>::data_at(size_type) const [CharT = char, Traits = std::char_traits<char>]"
                       );
        }
        if (cVar1 == local_18.data_[pos]) break;
      }
      uVar2 = uVar4;
      bVar3 = cVar1 == '\\';
    } while (uVar4 < local_18.size_);
  }
  if (local_18.size_ < pos) {
    pos = local_18.size_;
  }
  if (uVar4 < pos) {
    uVar4 = pos;
  }
  if (local_18.size_ <= uVar4) {
    uVar4 = local_18.size_;
  }
  bVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_18,pos,uVar4 - pos);
  __return_storage_ptr__->kind = String;
  (__return_storage_ptr__->text).data_ = bVar5.data_;
  (__return_storage_ptr__->text).size_ = bVar5.size_;
  return __return_storage_ptr__;
}

Assistant:

Token scan_string() {
		bool escape{false};
		for (;;) {
			if (m_pos >= m_in.size()) break;
			char ch = m_in[m_pos++];
			if (ch == '\\') {
				escape = true;
			} else if (!escape && ch == m_in[m_tok_start]) {
				break;
			} else {
				escape = false;
			}
		}
		return make_token(Token::Kind::String);
	}